

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Compiler(Compiler *this,AnnotationFlag annotationFlag)

{
  Own<capnp::compiler::Compiler::Impl> local_28;
  AnnotationFlag local_14;
  Compiler *pCStack_10;
  AnnotationFlag annotationFlag_local;
  Compiler *this_local;
  
  local_14 = annotationFlag;
  pCStack_10 = this;
  SchemaLoader::LazyLoadCallback::LazyLoadCallback(&this->super_LazyLoadCallback);
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_00cdb470;
  kj::heap<capnp::compiler::Compiler::Impl,capnp::compiler::Compiler::AnnotationFlag&>
            ((kj *)&local_28,&local_14);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>>::
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>>
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>> *)&this->impl,&local_28);
  kj::Own<capnp::compiler::Compiler::Impl>::~Own(&local_28);
  SchemaLoader::SchemaLoader(&this->loader,&this->super_LazyLoadCallback);
  return;
}

Assistant:

Compiler::Compiler(AnnotationFlag annotationFlag)
    : impl(kj::heap<Impl>(annotationFlag)),
      loader(*this) {}